

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O1

void * gpio_interrupt_handler(void *arg)

{
  timeval *__tv;
  uint uVar1;
  undefined4 *puVar2;
  code *pcVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  char *pcVar7;
  undefined1 *puVar8;
  uchar c;
  timeval time;
  char bu [64];
  undefined1 auStack_b8 [48];
  void *local_88;
  char local_78 [72];
  
  puVar8 = auStack_b8;
  if (arg == (void *)0x0) {
    pcVar7 = "gpio: interrupt_handler: context is invalid";
    iVar4 = 3;
  }
  else {
    snprintf(local_78,0x40,"/sys/class/gpio/gpio%d/value",(ulong)*arg);
    iVar4 = open(local_78,0);
    local_88 = arg;
    if (-1 < iVar4) {
      do {
        do {
          *(undefined1 **)(puVar8 + 0x38) = puVar8;
          puVar2 = *(undefined4 **)((long)arg + 0x70);
          *(int *)(puVar8 + 0x20) = iVar4;
          *(undefined2 *)(puVar8 + 0x24) = 2;
          *(undefined8 *)(puVar8 + -8) = 0x121e73;
          lseek(iVar4,0,0);
          *(undefined8 *)(puVar8 + -8) = 0x121e84;
          read(iVar4,puVar8 + 0xf,1);
          *(undefined8 *)(puVar8 + 0x10) = 0;
          *(undefined2 *)(puVar8 + 0x18) = 0;
          *(undefined2 *)(puVar8 + 0x10) = 0xff18;
          puVar8[0x12] = 0xff;
          __tv = (timeval *)(puVar8 + 0x10);
          *(undefined8 *)(puVar8 + -8) = 0x121eb3;
          write(_fd,__tv,3);
          *(undefined8 *)(puVar8 + -8) = 0x121ec7;
          poll((pollfd *)(puVar8 + 0x20),1,-1);
          *(undefined8 *)(puVar8 + 0x10) = 0;
          *(undefined2 *)(puVar8 + 0x18) = 0;
          *(undefined2 *)(puVar8 + 0x10) = 0xff18;
          puVar8[0x12] = 0xff;
          *(undefined8 *)(puVar8 + -8) = 0x121eef;
          write(_fd,__tv,3);
          if ((puVar8[0x26] & 2) == 0) {
            *puVar2 = 0xffffffff;
          }
          else {
            *(undefined8 *)(puVar8 + -8) = 0x121f10;
            read(iVar4,puVar8 + 0xf,1);
            *puVar2 = 0;
            *(undefined8 *)(puVar8 + -8) = 0x121f21;
            gettimeofday(__tv,(__timezone_ptr_t)0x0);
            uVar5 = (ulong)((double)*(long *)(puVar8 + 0x10) * 1000000.0 +
                           (double)*(long *)(puVar8 + 0x18));
            *(ulong *)(puVar2 + 2) =
                 (long)(((double)*(long *)(puVar8 + 0x10) * 1000000.0 +
                        (double)*(long *)(puVar8 + 0x18)) - 9.223372036854776e+18) &
                 (long)uVar5 >> 0x3f | uVar5;
          }
          puVar8 = *(undefined1 **)(puVar8 + 0x38);
          arg = *(void **)(puVar8 + 0x30);
        } while (*(int *)((long)arg + 0x2c) != 0);
        *(undefined8 *)(puVar8 + -8) = 0x121f84;
        pthread_setcancelstate(1,(int *)0x0);
        pcVar3 = *(code **)((long)arg + 0x10);
        if (pcVar3 != (code *)0x0) {
          *(undefined8 *)(puVar8 + -8) = 0x121f93;
          (*pcVar3)();
        }
        *(undefined8 *)(puVar8 + -8) = 0x121f9c;
        pthread_setcancelstate(0,(int *)0x0);
      } while( true );
    }
    uVar1 = *arg;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    syslog(3,"gpio%i: interrupt_handler: failed to open \'value\' : %s",(ulong)uVar1,pcVar7);
    pcVar7 = "failed to close and free sysfs event handles";
    iVar4 = 2;
  }
  syslog(iVar4,pcVar7);
  return (void *)0x0;
}

Assistant:

static void*
gpio_interrupt_handler(void* arg)
{
	if (arg == NULL) {
		syslog(LOG_ERR, "gpio: interrupt_handler: context is invalid");
		return NULL;
	}

	mraa_result_t ret;
	mraa_gpio_context dev = (mraa_gpio_context) arg;
	int idx = 0;

	int *fps = malloc(dev->num_pins * sizeof(int));
	if (!fps) {
		syslog(LOG_ERR, "mraa_gpio_interrupt_handler_multiple() malloc error");
		return NULL;
	}

	mraa_gpio_context it = dev;

	char bu[MAX_SIZE];
	snprintf(bu, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/value", it->pin);
	fps[idx] = open(bu, O_RDONLY);
	if (fps[idx] < 0) {
		syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to open 'value' : %s", it->pin,
				strerror(errno));
		gpio_close_event_handles_sysfs(fps, idx);
		return NULL;
	}

	idx++;

	for (;;) {
		ret = gpio_wait_interrupt(fps, idx, dev->events);

		if (ret == MRAA_SUCCESS && !dev->isr_thread_terminating) {
			pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
			if(dev->isr != NULL)
			{
				(dev->isr)(dev->isr_args);
			}
			pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
		}
	}
}